

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

void __thiscall notch::core::FullyConnectedLayer::calcOutput(FullyConnectedLayer *this)

{
  size_t sVar1;
  element_type *peVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float extraout_XMM0_Da;
  
  sVar1 = (this->inducedLocalField)._M_size;
  pfVar4 = (this->inducedLocalField)._M_data;
  pfVar5 = pfVar4 + sVar1;
  if (sVar1 == 0) {
    pfVar5 = (float *)0x0;
    pfVar4 = (float *)0x0;
  }
  if (pfVar4 != pfVar5) {
    peVar2 = (this->super_ABackpropLayer).shared.outputBuffer.
             super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pfVar3 = (float *)peVar2->_M_size;
    if (pfVar3 != (float *)0x0) {
      pfVar3 = peVar2->_M_data;
    }
    do {
      (*this->activationFunction->_vptr_Activation[1])(*pfVar4);
      *pfVar3 = extraout_XMM0_Da;
      pfVar4 = pfVar4 + 1;
      pfVar3 = pfVar3 + 1;
    } while (pfVar4 != pfVar5);
  }
  return;
}

Assistant:

virtual float operator()(float v) const { return a * tanh(b * v); }